

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

LispPTR COM_openfile(LispPTR *args)

{
  int iVar1;
  int iVar2;
  LispPTR *pLVar3;
  char *pcVar4;
  DLword *pDVar5;
  int *piVar6;
  bool bVar7;
  bool bVar8;
  LispPTR local_335c;
  ulong local_3358;
  char *local_3348;
  char *lf_cp;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp_1;
  OneDArray *lf_arrayp;
  stat sbuf;
  size_t slen;
  int *bufp;
  int flags;
  int link_check_flg;
  int fd;
  int rval;
  int dskp;
  int fatp;
  char ver [16];
  char name [255];
  char dir [4096];
  char host [255];
  char file [4096];
  char lfname [4101];
  LispPTR *args_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[5]);
    pLVar3 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar3 + 6) == 'C') {
      sbuf.__glibc_reserved[2] = (__syscall_slong_t)(int)pLVar3[2];
      rval = 0;
    }
    else if (*(char *)((long)pLVar3 + 6) == 'D') {
      sbuf.__glibc_reserved[2] = (__syscall_slong_t)(int)(pLVar3[2] << 1);
      rval = 1;
    }
    else {
      error("LispStringLength: Not a character array.\n");
    }
    if (rval == 0) {
      local_3358 = sbuf.__glibc_reserved[2] + 3;
    }
    else {
      local_3358 = sbuf.__glibc_reserved[2] + 5;
    }
    sbuf.__glibc_reserved[2] = local_3358;
    if (local_3358 < 0x1006) {
      pLVar3 = NativeAligned4FromLAddr(*args);
      if ((int)pLVar3[2] < 0x1000) {
        local_335c = pLVar3[2];
      }
      else {
        local_335c = 0x1000;
      }
      pcVar4 = (char *)(long)(int)local_335c;
      if (*(char *)((long)pLVar3 + 6) == 'C') {
        pDVar5 = NativeAligned2FromLAddr(*pLVar3 & 0xfffffff);
        lf_i = (size_t)(file + 0xff8);
        lf_dptr = (char *)((long)pDVar5 + (long)(int)(uint)(ushort)pLVar3[1]);
        for (lf_ii = 0; lf_ii < pcVar4; lf_ii = lf_ii + 1) {
          *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
          lf_i = lf_i + 1;
          lf_dptr = lf_dptr + 1;
        }
        (file + 0xff8)[(long)pcVar4] = '\0';
      }
      else if (*(char *)((long)pLVar3 + 6) == 'D') {
        pDVar5 = NativeAligned2FromLAddr(*pLVar3 & 0xfffffff);
        lf_length = (size_t)(pDVar5 + (int)(uint)(ushort)pLVar3[1]);
        lf_sbase = (short *)(file + 0xff8);
        for (lf_cp = (char *)0x0; lf_cp < pcVar4; lf_cp = lf_cp + 1) {
          *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
          lf_length = lf_length + 2;
          lf_sbase = (short *)((long)lf_sbase + 1);
        }
        *(undefined1 *)lf_sbase = 0;
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      separate_host(file + 0xff8,dir + 0xff8);
      for (local_3348 = dir + 0xff8; *local_3348 != '\0'; local_3348 = local_3348 + 1) {
        if (('`' < *local_3348) && (*local_3348 < '{')) {
          *local_3348 = *local_3348 + -0x20;
        }
      }
      iVar1 = strcmp(dir + 0xff8,"DSK");
      if (iVar1 == 0) {
        fd = 1;
      }
      else {
        iVar1 = strcmp(dir + 0xff8,"UNIX");
        if (iVar1 != 0) {
          return 0;
        }
        fd = 0;
      }
      unixpathname(file + 0xff8,host + 0xf8,fd,0);
      bVar8 = false;
      if (args[1] - 0xe0000 < 2) {
        switch(args[2]) {
        case 0xe0000:
          bufp._0_4_ = 0;
          break;
        case 0xe0001:
          bufp._0_4_ = 0x202;
          break;
        case 0xe0002:
          bufp._0_4_ = 2;
          break;
        case 0xe0003:
          bufp._0_4_ = 2;
        }
      }
      else {
        if (1 < args[1] - 0xe0002) {
          return 0;
        }
        switch(args[2]) {
        case 0xe0000:
          if (args[1] == 0xe0002) {
            return 0;
          }
          bufp._0_4_ = 0;
          break;
        case 0xe0001:
          bufp._0_4_ = 0x242;
          unpack_filename(host + 0xf8,name + 0xf8,ver + 8,(char *)&dskp,1);
          iVar1 = make_directory(name + 0xf8);
          if (iVar1 == 0) {
            return 0;
          }
          bVar8 = fd != 0;
          break;
        case 0xe0002:
          bufp._0_4_ = 0x42;
          unpack_filename(host + 0xf8,name + 0xf8,ver + 8,(char *)&dskp,1);
          iVar1 = make_directory(name + 0xf8);
          if (iVar1 == 0) {
            return 0;
          }
          bVar8 = fd != 0;
          break;
        case 0xe0003:
          bufp._0_4_ = 0x42;
          unpack_filename(host + 0xf8,name + 0xf8,ver + 8,(char *)&dskp,1);
          iVar1 = make_directory(name + 0xf8);
          if (iVar1 == 0) {
            return 0;
          }
          bVar8 = fd != 0;
        }
      }
      if (fd != 0) {
        iVar1 = unpack_filename(host + 0xf8,name + 0xf8,ver + 8,(char *)&dskp,1);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = true_name(name + 0xf8);
        if (iVar1 != -1) {
          return 0;
        }
        iVar1 = get_version_array(name + 0xf8,ver + 8);
        if (iVar1 == 0) {
          return 0;
        }
        if ((char)dskp == '\0') {
          strcpy(host + 0xf8,ver + 8);
        }
        else {
          strcpy(host + 0xf8,ver + 8);
          strcat(host + 0xf8,".~");
          strcat(host + 0xf8,(char *)&dskp);
          strcat(host + 0xf8,"~");
        }
        switch(args[1]) {
        case 0xe0000:
          iVar1 = get_old(name + 0xf8,VA.files,host + 0xf8,ver + 8);
          if (iVar1 == 0) {
            return 0;
          }
          break;
        case 0xe0001:
          iVar1 = get_oldest(name + 0xf8,VA.files,host + 0xf8,ver + 8);
          if (iVar1 == 0) {
            return 0;
          }
          break;
        case 0xe0002:
          iVar1 = get_new(name + 0xf8,VA.files,host + 0xf8,ver + 8);
          if (iVar1 == 0) {
            return 0;
          }
          break;
        case 0xe0003:
          iVar1 = get_old_new(name + 0xf8,VA.files,host + 0xf8,ver + 8);
          if (iVar1 == 0) {
            return 0;
          }
          break;
        default:
          return 0;
        }
      }
      if (fd != 0) {
        alarm(TIMEOUT_TIME);
        do {
          piVar6 = __errno_location();
          *piVar6 = 0;
          iVar1 = stat(host + 0xf8,(stat *)&lf_arrayp);
          bVar7 = false;
          if (iVar1 == -1) {
            piVar6 = __errno_location();
            bVar7 = *piVar6 == 4;
          }
        } while (bVar7);
        alarm(0);
        if (iVar1 == 0) {
          if (((uint)sbuf.st_nlink & 0xf000) != 0x8000) {
            *Lisp_errno = 0x17;
            return 0;
          }
        }
        else {
          piVar6 = __errno_location();
          if ((*piVar6 != 2) || (!bVar8)) {
            piVar6 = __errno_location();
            *Lisp_errno = *piVar6;
            return 0;
          }
        }
      }
      if ((fd != 0) && (bVar8)) {
        alarm(TIMEOUT_TIME);
        do {
          piVar6 = __errno_location();
          *piVar6 = 0;
          iVar1 = access(host + 0xf8,0);
          bVar7 = false;
          if (iVar1 == -1) {
            piVar6 = __errno_location();
            bVar7 = *piVar6 == 4;
          }
        } while (bVar7);
        alarm(0);
        if (iVar1 == -1) {
          piVar6 = __errno_location();
          if (*piVar6 != 2) {
            piVar6 = __errno_location();
            *Lisp_errno = *piVar6;
            return 0;
          }
          iVar1 = maintain_version(host + 0xf8,1);
          if (iVar1 == 0) {
            alarm(TIMEOUT_TIME);
            do {
              piVar6 = __errno_location();
              *piVar6 = 0;
              iVar1 = close(flags);
              bVar8 = false;
              if (iVar1 == -1) {
                piVar6 = __errno_location();
                bVar8 = *piVar6 == 4;
              }
            } while (bVar8);
            alarm(0);
            piVar6 = __errno_location();
            *Lisp_errno = *piVar6;
            return 0;
          }
        }
      }
      alarm(TIMEOUT_TIME);
      do {
        piVar6 = __errno_location();
        *piVar6 = 0;
        iVar1 = open(host + 0xf8,(int)bufp,0x1b6);
        bVar7 = false;
        if (iVar1 == -1) {
          piVar6 = __errno_location();
          bVar7 = *piVar6 == 4;
        }
      } while (bVar7);
      alarm(0);
      if (iVar1 == -1) {
        piVar6 = __errno_location();
        *Lisp_errno = *piVar6;
        args_local._4_4_ = 0;
      }
      else if (((fd == 0) || (!bVar8)) || (iVar2 = maintain_version(host + 0xf8,0), iVar2 != 0)) {
        alarm(TIMEOUT_TIME);
        do {
          piVar6 = __errno_location();
          *piVar6 = 0;
          iVar2 = fstat(iVar1,(stat *)&lf_arrayp);
          bVar8 = false;
          if (iVar2 == -1) {
            piVar6 = __errno_location();
            bVar8 = *piVar6 == 4;
          }
        } while (bVar8);
        alarm(0);
        if (iVar2 == -1) {
          alarm(TIMEOUT_TIME);
          do {
            piVar6 = __errno_location();
            *piVar6 = 0;
            iVar2 = close(iVar1);
            bVar8 = false;
            if (iVar2 == -1) {
              piVar6 = __errno_location();
              bVar8 = *piVar6 == 4;
            }
          } while (bVar8);
          alarm(0);
          piVar6 = __errno_location();
          *Lisp_errno = *piVar6;
          args_local._4_4_ = 0;
        }
        else {
          pLVar3 = NativeAligned4FromLAddr(args[3]);
          *pLVar3 = (int)sbuf.st_atim.tv_nsec + 0x1c94b00;
          pLVar3 = NativeAligned4FromLAddr(args[4]);
          if (((fd == 0) && (((uint)sbuf.st_nlink & 0xf000) != 0x8000)) &&
             (((uint)sbuf.st_nlink & 0xf000) != 0x4000)) {
            *pLVar3 = 0xffffffff;
          }
          else {
            *pLVar3 = (LispPTR)sbuf.st_rdev;
          }
          args_local._4_4_ = GetSmallp((long)iVar1);
        }
      }
      else {
        alarm(TIMEOUT_TIME);
        do {
          piVar6 = __errno_location();
          *piVar6 = 0;
          iVar2 = close(iVar1);
          bVar8 = false;
          if (iVar2 == -1) {
            piVar6 = __errno_location();
            bVar8 = *piVar6 == 4;
          }
        } while (bVar8);
        alarm(0);
        piVar6 = __errno_location();
        *Lisp_errno = *piVar6;
        args_local._4_4_ = 0;
      }
    }
    else {
      *Lisp_errno = 200;
      args_local._4_4_ = 0;
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR COM_openfile(LispPTR *args)
{
  char lfname[MAXPATHLEN + 5], file[MAXPATHLEN], host[MAXNAMLEN];
  char dir[MAXPATHLEN], name[MAXNAMLEN], ver[VERSIONLEN];
  int fatp, dskp, rval, fd, link_check_flg, flags, *bufp;
  size_t slen;
  struct stat sbuf;
#ifdef DOS
  char drive[1]; /* Drive designator */
  int extlen;    /* length of the raw file extension */
  char rawname[MAXNAMLEN];
#endif /* DOS */
  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[5]);

  LispStringLength(args[0], slen, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  slen = fatp ? slen + 4 + 1 : slen + 2 + 1;
  /* Add five for the host name field in Lisp format. */
  if (slen > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);

#ifdef DOS
  separate_host(lfname, host, drive);
#else
  separate_host(lfname, host);
#endif /* DOS */
  UPCASE(host);

  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

/*
 * Convert a Lisp file name to UNIX one.  If host is DSK, we also have to
 * convert a version field.
 */
#ifdef DOS
  unixpathname(lfname, file, dskp, 0, drive, &extlen, rawname);
#else
  unixpathname(lfname, file, dskp, 0);
#endif

  /*
   * Set up the flags argument for open system call.
   * And we have to handle the non existing directory case if the device is
   * DSK.
   * link_check_flg is used to determine whether we have to check a hard-link
   * based version control after opening a file.
   */
  link_check_flg = 0;
  switch (args[1]) {
    case RECOG_OLD:
    case RECOG_OLDEST:
      switch (args[2]) {
        case ACCESS_INPUT: flags = O_RDONLY; break;

        case ACCESS_OUTPUT:
          /*
           * The current implementation of Lisp page mapped device requires
           * that the output stream being "readable"!
           */
          flags = O_RDWR | O_TRUNC;
          break;

        case ACCESS_BOTH: flags = O_RDWR; break;

        case ACCESS_APPEND:
          /*
           * Should be O_WRONLY | O_APPEND.  But Lisp needs it.
           */
          flags = O_RDWR;
          break;
      }
      break;
    case RECOG_NEW:
    case RECOG_OLD_NEW:
      /*
       * In DSK device, the not existing yet file can be recognized.  In this
       * case, if there is a chance to create a new file, we have to make
       * sure that all directory to reach the recognized file exists.
       * Also we have to check the versionless file is correctly maintained
       * or not when we have a chance to create a new file.
       */
      switch (args[2]) {
        case ACCESS_INPUT:
          if (args[1] == RECOG_NEW) {
            /*
             * Opening a input stream to a new, not yet
             * existing, file does not make sense.
             */
            return (NIL);
          } else {
            /*
             * Even if OLD/NEW recognition, opening a input
             * stream never try to create a new file.  Thus,
             * without O_CREAT.
             */
            flags = O_RDONLY;
          }
          break;

        case ACCESS_OUTPUT:
          flags = O_RDWR | O_TRUNC | O_CREAT;
          unpack_filename(file, dir, name, ver, 1);
          if (make_directory(dir) == 0) return (NIL);
          if (dskp) link_check_flg = 1;
          break;

        case ACCESS_BOTH:
          flags = O_RDWR | O_CREAT;
          unpack_filename(file, dir, name, ver, 1);
          if (make_directory(dir) == 0) return (NIL);
          if (dskp) link_check_flg = 1;
          break;

        case ACCESS_APPEND:
          flags = O_RDWR | O_CREAT;
          unpack_filename(file, dir, name, ver, 1);
          if (make_directory(dir) == 0) return (NIL);
          if (dskp) link_check_flg = 1;
          break;
      }
      break;

    default: return (NIL);
  }

  /*
   * The file name which has been passed from Lisp is sometimes different
   * from the actual file name on DSK, even after the Lisp name is converted
   * to UNIX form with unixpathname.  Lisp always recognize a file on DSK
   * with version.  If the versionless file exists and it is not correctly
   * maintained, that is it is not hard linked to the existing highest
   * versioned file, Lisp regards such link missing versionless file as
   * the highest versioned file, but the actual name on the file system
   * is still versionless.
   * get_old, get_oldest, get_new, get_old_new routines handle all of the
   * complicated cases correctly and let us know the "Lisp recognizing"
   * name and "Real" name.  Both of them are UNIX format.
   * At this point, we will use one of the four routines and get the
   * real name.  We can use it to open a file which is requested from Lisp
   * with the "Lisp recognizing" name.
   */

  if (dskp) {
    if (unpack_filename(file, dir, name, ver, 1) == 0) return (NIL);
    if (true_name(dir) != -1) return (0);
    if (get_version_array(dir, name) == 0) return (NIL);
    ConcNameAndVersion(name, ver, file);

    switch (args[1]) {
      case RECOG_OLD:
        if (get_old(dir, VA.files, file, name) == 0) return (NIL);
        break;

      case RECOG_OLDEST:
        if (get_oldest(dir, VA.files, file, name) == 0) return (NIL);
        break;

      case RECOG_NEW:
        if (get_new(dir, VA.files, file, name) == 0) return (NIL);
        break;

      case RECOG_OLD_NEW:
        if (get_old_new(dir, VA.files, file, name) == 0) return (NIL);
        break;

      default: return (NIL);
    }
  }

  /*
   * DSK device only allow to open a regular file.
   */
  if (dskp) {
    TIMEOUT(rval = stat(file, &sbuf));
    if (rval == 0) {
      if (!S_ISREG(sbuf.st_mode)) {
        /*
         * The Lisp code handles this case as same as "file table
         * overflow" error.  Final error message is "File won't
         * open".
         */
        *Lisp_errno = ENFILE;
        return (NIL);
      }
    } else {
      /*
       * When stat failed, only if the reason is "file does not
       * exist" and we are trying to open a file with a mode we can
       * create a new file, we can proceed.
       */
      if (errno != ENOENT || !link_check_flg) {
        *Lisp_errno = errno;
        return (NIL);
      }
    }
  }
  if (dskp && link_check_flg) {
    /*
     * When we are opening a file with a mode we might create a new file,
     * we have to make sure that versionless file is maintained
     * correctly before we actually creating a new file, because a
     * created new file will change the status and the recognition on
     * the same file with the same recognition mode will return the
     * different result.
     * At this point, the third argument for maintain_version, forcep is
     * 1, because a lonly versionless file should be linked to version 1.
     * If we are opening a file recognized with new mode, version 2,
     * without pre-linking a versionless to version 1, the final
     * clean up maintain_version will link the versionless to version 3.
     */
    TIMEOUT(rval = access(file, F_OK));
    if (rval == -1) {
      if (errno == ENOENT) {
        /*
         * Actually we are creating a new file.  We have to
         * maintain a version status.
         */
        if (maintain_version(file, 1) == 0) {
          TIMEOUT(rval = close(fd));
          *Lisp_errno = errno;
          return (NIL);
        }
      } else {
        /*
         * Because of other reason, access call failed.
         */
        *Lisp_errno = errno;
        return (NIL);
      }
    } else {
/*
 * The subjective file has already existed.  We don't need
 * to maintain a version.
 */
#ifdef DOS
      if (args[1] == RECOG_NEW) {
        char old[MAXPATHLEN];
        make_old_version(old, file);
        unlink(old);
        rename(file, old); /* make old version */
      }
#endif /* DOS */
    }
  }

  /*
   * If a new file is created, its actual mode is computed from the
   * third argument for open and the process's umask.  I'm pretty sure
   * 0666 would be most appropriate mode to specify here.
   */
  TIMEOUT(fd = open(file, flags, 0666));
  if (fd == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  if (dskp && link_check_flg) {
    /*
     * Again we have to maintain version to clean up the directory.
     * This time we invoke maintain_version with forcep off, because
     * the entirely newly created file, versionless file, should not
     * be linked to any file.
     */
    if (maintain_version(file, 0) == 0) {
      TIMEOUT(close(fd));
      *Lisp_errno = errno;
      return (NIL);
    }
  }

  TIMEOUT(rval = fstat(fd, &sbuf));
  if (rval == -1) {
    TIMEOUT(close(fd));
    *Lisp_errno = errno;
    return (NIL);
  }

  bufp = (int *)NativeAligned4FromLAddr(args[3]);
  *bufp = ToLispTime(sbuf.st_mtime);

  bufp = (int *)NativeAligned4FromLAddr(args[4]);
  if (!dskp && (!S_ISREG(sbuf.st_mode)) && (!S_ISDIR(sbuf.st_mode))) {
    /*
     * Not a regular file or directory file.  Put on a marker.
     */
    *bufp = SPECIALFILEMARK;
  } else {
    *bufp = sbuf.st_size;
  }

  return (GetSmallp(fd));
}